

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O0

ValueProxy * __thiscall
LLVMBC::LLVMContext::
construct<LLVMBC::ValueProxy,LLVMBC::Type*&,LLVMBC::ModuleParseContext&,unsigned_long&>
          (LLVMContext *this,Type **u,ModuleParseContext *u_1,unsigned_long *u_2)

{
  ValueProxy *this_00;
  ValueProxy *t;
  ValueProxy *mem;
  unsigned_long *u_local_2;
  ModuleParseContext *u_local_1;
  Type **u_local;
  LLVMContext *this_local;
  
  this_00 = (ValueProxy *)allocate(this,0x30,8);
  if (this_00 == (ValueProxy *)0x0) {
    std::terminate();
  }
  ValueProxy::ValueProxy(this_00,*u,u_1,*u_2);
  return this_00;
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}